

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdPackage.cpp
# Opt level: O2

PackageSymbol * slang::ast::builtins::createStdPackage(Compilation *c)

{
  Type *retType;
  PackageSymbol *pPVar1;
  Scope *this;
  EnumType *pEVar2;
  EnumValueSymbol *this_00;
  TransparentMemberSymbol *symbol;
  TypeAliasType *retType_00;
  GenericClassDefSymbol *this_01;
  Type *pTVar3;
  ClassType *pCVar4;
  long lVar5;
  Scope *this_02;
  uint64_t value;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view name_06;
  string_view name_07;
  function_ref<void_(slang::ast::Compilation_&,_slang::ast::ClassType_&)> specializeFunc;
  string_view name_08;
  LookupLocation lookupLocation;
  string_view name_09;
  string_view name_10;
  string_view name_11;
  string_view name_12;
  string_view name_13;
  string_view name_14;
  string_view name_15;
  string_view name_16;
  string_view name_17;
  string_view name_18;
  string_view name_19;
  string_view name_20;
  string_view name_21;
  string_view name_22;
  string_view name_23;
  ClassBuilder builder;
  SVInt defaultOne;
  MethodBuilder self;
  _Optional_payload_base<slang::SVInt> local_318;
  MethodBuilder set_randstate;
  _Optional_payload_base<slang::SVInt> local_2b0;
  char *name;
  MethodBuilder srandom;
  ASTContext enumCtx;
  MethodBuilder local_1c0;
  MethodBuilder local_170;
  MethodBuilder local_120;
  MethodBuilder try_get;
  MethodBuilder get;
  
  self.compilation._0_4_ = 1;
  pPVar1 = BumpAllocator::
           emplace<slang::ast::PackageSymbol,slang::ast::Compilation&,char_const(&)[4],slang::SourceLocation_const&,slang::ast::NetType_const&,slang::ast::VariableLifetime>
                     (&c->super_BumpAllocator,c,(char (*) [4])"std",
                      (SourceLocation *)&SourceLocation::NoLocation,c->wireNetType,
                      (VariableLifetime *)&self);
  this = &pPVar1->super_Scope;
  name_08._M_str = "process";
  name_08._M_len = 7;
  ClassBuilder::ClassBuilder(&builder,c,name_08);
  (builder.type)->isAbstract = true;
  pCVar4 = builder.type;
  if (builder.type != (ClassType *)0x0) {
    pCVar4 = (ClassType *)&(builder.type)->super_Scope;
  }
  lookupLocation._8_8_ = 1;
  lookupLocation.scope = (Scope *)pCVar4;
  ASTContext::ASTContext
            (&enumCtx,&(builder.type)->super_Scope,lookupLocation,(bitmask<slang::ast::ASTFlags>)0x0
            );
  pEVar2 = BumpAllocator::
           emplace<slang::ast::EnumType,slang::ast::Compilation&,slang::SourceLocation_const&,slang::ast::Type_const&,slang::ast::ASTContext&>
                     (&c->super_BumpAllocator,c,(SourceLocation *)&SourceLocation::NoLocation,
                      c->intType,&enumCtx);
  pEVar2->systemId = 0x7ffff7ff;
  value = 0;
  for (lVar5 = 0; lVar5 != 0x28; lVar5 = lVar5 + 8) {
    name = *(char **)((long)&PTR_anon_var_dwarf_dafa49_00476f08 + lVar5);
    this_00 = BumpAllocator::
              emplace<slang::ast::EnumValueSymbol,char_const*&,slang::SourceLocation_const&>
                        (&c->super_BumpAllocator,&name,(SourceLocation *)&SourceLocation::NoLocation
                        );
    (this_00->super_ValueSymbol).declaredType.type = (Type *)pEVar2;
    Scope::addMember(&pEVar2->super_Scope,(Symbol *)this_00);
    SVInt::SVInt((SVInt *)&self,0x20,value,true);
    std::
    variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
    ::variant<slang::SVInt,void,void,slang::SVInt,void>
              ((variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                *)&defaultOne,(SVInt *)&self);
    EnumValueSymbol::setValue(this_00,(ConstantValue *)&defaultOne);
    value = value + 1;
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)&defaultOne);
    SVInt::~SVInt((SVInt *)&self);
    this_02 = &(builder.type)->super_Scope;
    symbol = BumpAllocator::
             emplace<slang::ast::TransparentMemberSymbol,slang::ast::EnumValueSymbol&>
                       (&c->super_BumpAllocator,this_00);
    Scope::addMember(this_02,&symbol->super_Symbol);
  }
  retType_00 = BumpAllocator::
               emplace<slang::ast::TypeAliasType,char_const(&)[6],slang::SourceLocation_const&>
                         (&c->super_BumpAllocator,(char (*) [6])0x386e59,
                          (SourceLocation *)&SourceLocation::NoLocation);
  (retType_00->targetType).type = (Type *)pEVar2;
  Scope::addMember(&(builder.type)->super_Scope,(Symbol *)retType_00);
  pTVar3 = c->voidType;
  name_09._M_str = "self";
  name_09._M_len = 4;
  ClassBuilder::addMethod(&self,&builder,name_09,&(builder.type)->super_Type,Function);
  MethodBuilder::addFlags(&self,(bitmask<slang::ast::MethodFlags>)0x4);
  name_10._M_str = "status";
  name_10._M_len = 6;
  ClassBuilder::addMethod((MethodBuilder *)&name,&builder,name_10,&retType_00->super_Type,Function);
  MethodBuilder::~MethodBuilder((MethodBuilder *)&name);
  name_11._M_str = "kill";
  name_11._M_len = 4;
  ClassBuilder::addMethod(&get,&builder,name_11,pTVar3,Function);
  MethodBuilder::~MethodBuilder(&get);
  name_12._M_str = "await";
  name_12._M_len = 5;
  ClassBuilder::addMethod(&try_get,&builder,name_12,pTVar3,Task);
  MethodBuilder::~MethodBuilder(&try_get);
  name_13._M_str = "suspend";
  name_13._M_len = 7;
  ClassBuilder::addMethod(&local_120,&builder,name_13,pTVar3,Function);
  MethodBuilder::~MethodBuilder(&local_120);
  name_14._M_str = "resume";
  name_14._M_len = 6;
  ClassBuilder::addMethod(&local_170,&builder,name_14,pTVar3,Function);
  MethodBuilder::~MethodBuilder(&local_170);
  name_15._M_str = "get_randstate";
  name_15._M_len = 0xd;
  ClassBuilder::addMethod(&local_1c0,&builder,name_15,c->stringType,Function);
  MethodBuilder::~MethodBuilder(&local_1c0);
  name_16._M_str = "srandom";
  name_16._M_len = 7;
  ClassBuilder::addMethod(&srandom,&builder,name_16,pTVar3,Function);
  local_2b0._M_engaged = false;
  name_00._M_str = "seed";
  name_00._M_len = 4;
  MethodBuilder::addArg(&srandom,name_00,c->intType,In,(optional<slang::SVInt> *)&local_2b0);
  std::_Optional_payload_base<slang::SVInt>::_M_reset(&local_2b0);
  name_17._M_str = "set_randstate";
  name_17._M_len = 0xd;
  ClassBuilder::addMethod(&set_randstate,&builder,name_17,pTVar3,Function);
  local_318._M_engaged = false;
  name_01._M_str = "state";
  name_01._M_len = 5;
  MethodBuilder::addArg
            (&set_randstate,name_01,c->stringType,In,(optional<slang::SVInt> *)&local_318);
  std::_Optional_payload_base<slang::SVInt>::_M_reset(&local_318);
  MethodBuilder::~MethodBuilder(&set_randstate);
  MethodBuilder::~MethodBuilder(&srandom);
  MethodBuilder::~MethodBuilder(&self);
  Scope::addMember(this,(Symbol *)builder.type);
  name_18._M_str = "semaphore";
  name_18._M_len = 9;
  ClassBuilder::ClassBuilder((ClassBuilder *)&set_randstate,c,name_18);
  pTVar3 = c->intType;
  retType = c->voidType;
  SVInt::SVInt((SVInt *)&enumCtx,0x20,0,true);
  SVInt::SVInt(&defaultOne,0x20,1,true);
  name_19._M_str = "new";
  name_19._M_len = 3;
  ClassBuilder::addMethod(&self,(ClassBuilder *)&set_randstate,name_19,retType,Function);
  MethodBuilder::addFlags(&self,(bitmask<slang::ast::MethodFlags>)0x8);
  std::_Optional_payload_base<slang::SVInt>::_Optional_payload_base<slang::SVInt&>
            ((_Optional_payload_base<slang::SVInt> *)&local_120,&enumCtx);
  name_02._M_str = "keyCount";
  name_02._M_len = 8;
  MethodBuilder::addArg(&self,name_02,pTVar3,In,(optional<slang::SVInt> *)&local_120);
  std::_Optional_payload_base<slang::SVInt>::_M_reset
            ((_Optional_payload_base<slang::SVInt> *)&local_120);
  name_20._M_str = "put";
  name_20._M_len = 3;
  ClassBuilder::addMethod
            ((MethodBuilder *)&name,(ClassBuilder *)&set_randstate,name_20,retType,Function);
  std::_Optional_payload_base<slang::SVInt>::_Optional_payload_base<slang::SVInt&>
            ((_Optional_payload_base<slang::SVInt> *)&local_170,&defaultOne);
  name_03._M_str = "keyCount";
  name_03._M_len = 8;
  MethodBuilder::addArg
            ((MethodBuilder *)&name,name_03,pTVar3,In,(optional<slang::SVInt> *)&local_170);
  std::_Optional_payload_base<slang::SVInt>::_M_reset
            ((_Optional_payload_base<slang::SVInt> *)&local_170);
  name_21._M_str = "get";
  name_21._M_len = 3;
  ClassBuilder::addMethod(&get,(ClassBuilder *)&set_randstate,name_21,retType,Task);
  std::_Optional_payload_base<slang::SVInt>::_Optional_payload_base<slang::SVInt&>
            ((_Optional_payload_base<slang::SVInt> *)&local_1c0,&defaultOne);
  name_04._M_str = "keyCount";
  name_04._M_len = 8;
  MethodBuilder::addArg(&get,name_04,pTVar3,In,(optional<slang::SVInt> *)&local_1c0);
  std::_Optional_payload_base<slang::SVInt>::_M_reset
            ((_Optional_payload_base<slang::SVInt> *)&local_1c0);
  name_22._M_str = "try_get";
  name_22._M_len = 7;
  ClassBuilder::addMethod(&try_get,(ClassBuilder *)&set_randstate,name_22,pTVar3,Function);
  std::_Optional_payload_base<slang::SVInt>::_Optional_payload_base<slang::SVInt&>
            ((_Optional_payload_base<slang::SVInt> *)&srandom,&defaultOne);
  name_05._M_str = "keyCount";
  name_05._M_len = 8;
  MethodBuilder::addArg(&try_get,name_05,pTVar3,In,(optional<slang::SVInt> *)&srandom);
  std::_Optional_payload_base<slang::SVInt>::_M_reset
            ((_Optional_payload_base<slang::SVInt> *)&srandom);
  MethodBuilder::~MethodBuilder(&try_get);
  MethodBuilder::~MethodBuilder(&get);
  MethodBuilder::~MethodBuilder((MethodBuilder *)&name);
  MethodBuilder::~MethodBuilder(&self);
  SVInt::~SVInt(&defaultOne);
  SVInt::~SVInt((SVInt *)&enumCtx);
  Scope::addMember(this,&(set_randstate.symbol)->super_Symbol);
  this_01 = (GenericClassDefSymbol *)
            BumpAllocator::allocate(&(c->genericClassAllocator).super_BumpAllocator,0x228,8);
  name_06._M_str = "mailbox";
  name_06._M_len = 7;
  specializeFunc.callable = (intptr_t)&name;
  specializeFunc.callback =
       function_ref<void(slang::ast::Compilation&,slang::ast::ClassType&)>::
       callback_fn<slang::ast::builtins::createMailboxClass(slang::ast::Compilation&)::__0>;
  GenericClassDefSymbol::GenericClassDefSymbol
            (this_01,name_06,(SourceLocation)0xffffffffffffffff,specializeFunc);
  pTVar3 = Compilation::getType(c,Untyped);
  name_07._M_str = "T";
  name_07._M_len = 1;
  Definition::ParameterDecl::ParameterDecl
            ((ParameterDecl *)&self,name_07,(SourceLocation)0xffffffffffffffff,false,true,pTVar3);
  GenericClassDefSymbol::addParameterDecl(this_01,(ParameterDecl *)&self);
  Scope::addMember(this,(Symbol *)this_01);
  name_23._M_str = "randomize";
  name_23._M_len = 9;
  MethodBuilder::MethodBuilder(&self,c,name_23,c->intType,Function);
  MethodBuilder::addFlags(&self,(bitmask<slang::ast::MethodFlags>)0x400);
  MethodBuilder::~MethodBuilder(&self);
  Scope::addMember(this,&(self.symbol)->super_Symbol);
  return pPVar1;
}

Assistant:

const PackageSymbol& createStdPackage(Compilation& c) {
    auto pkg = c.emplace<PackageSymbol>(c, "std", NL, c.getWireNetType(), VariableLifetime::Static);
    pkg->addMember(createProcessClass(c));
    pkg->addMember(createSemaphoreClass(c));
    pkg->addMember(createMailboxClass(c));
    pkg->addMember(createRandomizeFunc(c));

    return *pkg;
}